

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

bool __thiscall branch_and_reduce_algorithm::dinicDFS(branch_and_reduce_algorithm *this,int v)

{
  int iVar1;
  int v_00;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference this_00;
  int w;
  int u;
  int v_local;
  branch_and_reduce_algorithm *this_local;
  
  do {
    do {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->iter,(long)v);
      if (*pvVar4 < 0) {
        return false;
      }
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->adj,(long)v);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->iter,(long)v);
      iVar1 = *pvVar4;
      *pvVar4 = iVar1 + -1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar1);
      iVar1 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->in,(long)iVar1);
      v_00 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar1);
    } while (-1 < *pvVar4);
    if (v_00 < 0) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->level,(long)v);
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->level,(long)v_00);
  } while (((*pvVar4 <= iVar2) ||
           (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->iter,(long)v_00),
           *pvVar4 < 0)) || (bVar3 = dinicDFS(this,v_00), !bVar3));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->in,(long)iVar1);
  *pvVar4 = v;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->out,(long)v);
  *pvVar4 = iVar1;
  return true;
}

Assistant:

bool branch_and_reduce_algorithm::dinicDFS(int v)
{
    while (iter[v] >= 0)
    {
        int u = adj[v][iter[v]--], w = in[u];
        if (x[u] >= 0)
            continue;
        if (w < 0 || (level[v] < level[w] && iter[w] >= 0 && dinicDFS(w)))
        {
            in[u] = v;
            out[v] = u;
            return true;
        }
    }
    return false;
}